

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_aggregate_context(sqlite3_context *p,int nByte)

{
  Mem *p_00;
  
  p_00 = p->pMem;
  if ((p_00->flags & 0x2000) == 0) {
    if (nByte < 1) {
      sqlite3VdbeMemReleaseExternal(p_00);
      p_00->flags = 1;
      p_00->z = (char *)0x0;
    }
    else {
      sqlite3VdbeMemGrow(p_00,nByte,0);
      p_00->flags = 0x2000;
      p_00->u = (anon_union_8_5_44880d43_for_u)p->pFunc;
      if (p_00->z != (char *)0x0) {
        memset(p_00->z,0,(ulong)(uint)nByte);
      }
    }
  }
  return p_00->z;
}

Assistant:

SQLITE_API void *sqlite3_aggregate_context(sqlite3_context *p, int nByte){
  Mem *pMem;
  assert( p && p->pFunc && p->pFunc->xStep );
  assert( sqlite3_mutex_held(p->s.db->mutex) );
  pMem = p->pMem;
  testcase( nByte<0 );
  if( (pMem->flags & MEM_Agg)==0 ){
    if( nByte<=0 ){
      sqlite3VdbeMemReleaseExternal(pMem);
      pMem->flags = MEM_Null;
      pMem->z = 0;
    }else{
      sqlite3VdbeMemGrow(pMem, nByte, 0);
      pMem->flags = MEM_Agg;
      pMem->u.pDef = p->pFunc;
      if( pMem->z ){
        memset(pMem->z, 0, nByte);
      }
    }
  }
  return (void*)pMem->z;
}